

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_lock_open_read(char *file,int *fd,kvtree *hash)

{
  mode_t mode;
  int fd_00;
  undefined8 uVar1;
  char *fmt;
  
  if (fd == (int *)0x0) {
    fmt = "Must provide a pointer to an int to return opened file descriptor @ %s:%d";
    uVar1 = 0x63d;
  }
  else {
    *fd = -1;
    if (file == (char *)0x0) {
      fmt = "No filename specified @ %s:%d";
      uVar1 = 0x649;
    }
    else {
      if (hash != (kvtree *)0x0) {
        mode = kvtree_getmode(1,1,0);
        fd_00 = kvtree_open_with_lock(file,0x42,mode,1);
        *fd = fd_00;
        if (fd_00 < 0) {
          return 1;
        }
        kvtree_read_fd(file,fd_00,hash);
        return 0;
      }
      fmt = "No hash provided to read data into @ %s:%d";
      uVar1 = 0x651;
    }
  }
  kvtree_err(fmt,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
             ,uVar1);
  return 1;
}

Assistant:

int kvtree_lock_open_read(const char* file, int* fd, kvtree* hash)
{
  /* check that we got a pointer to a file descriptor */
  if (fd == NULL) {
    kvtree_err("Must provide a pointer to an int to return opened file descriptor @ %s:%d",
      __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* we at least got a pointer to a file descriptor,
   * initialize it to -1 */
  *fd = -1;

  /* check that we got a filename */
  if (file == NULL) {
    kvtree_err("No filename specified @ %s:%d",
      __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* check that we got a hash to read data into */
  if (hash == NULL) {
    kvtree_err("No hash provided to read data into @ %s:%d",
      __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* open file with lock for read / write access */
  mode_t mode_file = kvtree_getmode(1, 1, 0);

  /*
   * NOTE: even though this function is kvtree_lock_open_read(), we still
   * take a write lock below since our code uses it for a read-modify-write.
   */
  *fd = kvtree_open_with_lock(file, O_RDWR | O_CREAT, mode_file, 1);
  if (*fd >= 0) {
    /* read the file into the hash */
    kvtree_read_fd(file, *fd, hash);
    return KVTREE_SUCCESS;
  }

  return KVTREE_FAILURE;
}